

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_bgr2rgb(Mat *m,uchar *rgb,int stride)

{
  int *piVar1;
  int in_EDX;
  undefined1 *in_RSI;
  long *in_RDI;
  int remain;
  int y;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  int h;
  int w;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  int local_3a4 [3];
  int local_398 [3];
  int local_38c [3];
  int local_380;
  int local_37c;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined4 local_360;
  long local_358;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 local_340;
  undefined8 local_338;
  float *local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined4 local_310;
  long local_308;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined8 local_2e8;
  float *local_2e0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  long local_2a8;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined8 local_288;
  float *local_280;
  int local_278;
  int local_274;
  int local_270;
  undefined1 *local_268;
  undefined8 *local_258;
  undefined8 *local_248;
  undefined8 *local_238;
  undefined8 *local_210;
  undefined8 *local_1f0;
  undefined8 *local_1d0;
  undefined1 local_195;
  undefined4 local_194;
  undefined8 *local_188;
  long local_178;
  undefined4 local_16c;
  long local_168;
  float *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  undefined4 local_13c;
  long local_138;
  undefined1 local_115;
  undefined4 local_114;
  undefined8 *local_108;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  float *local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined1 local_95;
  undefined4 local_94;
  undefined8 *local_88;
  long local_78;
  undefined4 local_6c;
  long local_68;
  float *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_270 = *(int *)((long)in_RDI + 0x2c);
  local_274 = (int)in_RDI[6];
  local_278 = in_EDX + local_270 * -3;
  if (local_278 == 0) {
    local_270 = local_270 * local_274;
    local_274 = 1;
  }
  local_88 = &local_2c8;
  local_4c = *(int *)((long)in_RDI + 0x2c);
  local_50 = (int)in_RDI[6];
  local_54 = *(undefined4 *)((long)in_RDI + 0x34);
  local_280 = (float *)*in_RDI;
  local_68 = in_RDI[2];
  local_6c = (undefined4)in_RDI[3];
  local_78 = in_RDI[4];
  local_48 = &local_2c8;
  local_38 = (long)local_4c * (long)local_50 * local_68;
  local_8 = &local_2c8;
  local_258 = &local_2c8;
  local_108 = &local_328;
  local_cc = *(int *)((long)in_RDI + 0x2c);
  local_d0 = (int)in_RDI[6];
  local_d4 = *(undefined4 *)((long)in_RDI + 0x34);
  local_2e0 = (float *)(*in_RDI + in_RDI[8] * in_RDI[2]);
  local_e8 = in_RDI[2];
  local_ec = (undefined4)in_RDI[3];
  local_f8 = in_RDI[4];
  local_c8 = &local_328;
  local_b8 = (long)local_cc * (long)local_d0 * local_e8;
  local_10 = &local_328;
  local_248 = &local_328;
  local_188 = &local_378;
  local_14c = *(int *)((long)in_RDI + 0x2c);
  local_150 = (int)in_RDI[6];
  local_154 = *(undefined4 *)((long)in_RDI + 0x34);
  local_330 = (float *)(*in_RDI + in_RDI[8] * 2 * in_RDI[2]);
  local_168 = in_RDI[2];
  local_16c = (undefined4)in_RDI[3];
  local_178 = in_RDI[4];
  local_148 = &local_378;
  local_138 = (long)local_14c * (long)local_150 * local_168;
  local_18 = &local_378;
  local_238 = &local_378;
  local_290 = 0;
  local_294 = 0;
  local_298 = 0;
  local_29c = 0;
  local_2b0 = 0;
  local_2b8 = 0;
  local_2c0 = 0;
  local_2c8 = 0;
  local_2f0 = 0;
  local_2f4 = 0;
  local_2f8 = 0;
  local_2fc = 0;
  local_310 = 0;
  local_318 = 0;
  local_320 = 0;
  local_328 = 0;
  local_3c = 0x10;
  local_94 = 0;
  local_95 = 1;
  local_bc = 0x10;
  local_114 = 1;
  local_115 = 1;
  local_13c = 0x10;
  local_194 = 2;
  local_195 = 1;
  local_288 = 0;
  local_2a0 = 0;
  local_2e8 = 0;
  local_300 = 0;
  local_378 = 0;
  local_368 = 0;
  local_360 = 0;
  local_350 = 0;
  local_34c = 0;
  local_348 = 0;
  local_344 = 0;
  local_340 = 0;
  local_338 = 0;
  local_370 = 0;
  local_268 = in_RSI;
  local_210 = local_238;
  local_1f0 = local_248;
  local_1d0 = local_258;
  local_160 = local_330;
  local_e0 = local_2e0;
  local_60 = local_280;
  local_358 = local_178;
  local_308 = local_f8;
  local_2a8 = local_78;
  for (local_37c = 0; local_37c < local_274; local_37c = local_37c + 1) {
    for (local_380 = local_270; 0 < local_380; local_380 = local_380 + -1) {
      local_38c[2] = (int)*local_280;
      local_38c[1] = 0;
      piVar1 = std::max<int>(local_38c + 2,local_38c + 1);
      local_38c[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_38c);
      local_268[2] = (char)*piVar1;
      local_398[2] = (int)*local_2e0;
      local_398[1] = 0;
      piVar1 = std::max<int>(local_398 + 2,local_398 + 1);
      local_398[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_398);
      local_268[1] = (char)*piVar1;
      local_3a4[2] = (int)*local_330;
      local_3a4[1] = 0;
      piVar1 = std::max<int>(local_3a4 + 2,local_3a4 + 1);
      local_3a4[0] = 0xff;
      piVar1 = std::min<int>(piVar1,local_3a4);
      *local_268 = (char)*piVar1;
      local_268 = local_268 + 3;
      local_280 = local_280 + 1;
      local_2e0 = local_2e0 + 1;
      local_330 = local_330 + 1;
    }
    local_268 = local_268 + local_278;
  }
  return;
}

Assistant:

static void to_bgr2rgb(const Mat& m, unsigned char* rgb, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w * 3;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr0 = m.channel(0);
    const float* ptr1 = m.channel(1);
    const float* ptr2 = m.channel(2);

    for (int y = 0; y < h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
        for (; nn > 0; nn--)
        {
            float32x4_t _rlow = vld1q_f32(ptr2);
            float32x4_t _rhigh = vld1q_f32(ptr2 + 4);
            float32x4_t _glow = vld1q_f32(ptr1);
            float32x4_t _ghigh = vld1q_f32(ptr1 + 4);
            float32x4_t _blow = vld1q_f32(ptr0);
            float32x4_t _bhigh = vld1q_f32(ptr0 + 4);

            int16x8_t _r16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_rlow)), vmovn_s32(vcvtq_s32_f32(_rhigh)));
            int16x8_t _g16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_glow)), vmovn_s32(vcvtq_s32_f32(_ghigh)));
            int16x8_t _b16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_blow)), vmovn_s32(vcvtq_s32_f32(_bhigh)));

            uint8x8x3_t _rgb;
            _rgb.val[0] = vqmovun_s16(_r16);
            _rgb.val[1] = vqmovun_s16(_g16);
            _rgb.val[2] = vqmovun_s16(_b16);

            vst3_u8(rgb, _rgb);

            rgb += 3 * 8;
            ptr0 += 8;
            ptr1 += 8;
            ptr2 += 8;
        }
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            rgb[2] = SATURATE_CAST_UCHAR(*ptr0);
            rgb[1] = SATURATE_CAST_UCHAR(*ptr1);
            rgb[0] = SATURATE_CAST_UCHAR(*ptr2);

            rgb += 3;
            ptr0++;
            ptr1++;
            ptr2++;
        }

#undef SATURATE_CAST_UCHAR
        rgb += wgap;
    }
}